

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint LodePNGIText_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  uint uVar1;
  size_t sStack_28;
  uint error;
  size_t i;
  LodePNGInfo *source_local;
  LodePNGInfo *dest_local;
  
  dest->itext_keys = (char **)0x0;
  dest->itext_langtags = (char **)0x0;
  dest->itext_transkeys = (char **)0x0;
  dest->itext_strings = (char **)0x0;
  dest->itext_num = 0;
  sStack_28 = 0;
  while( true ) {
    if (sStack_28 == source->itext_num) {
      return 0;
    }
    uVar1 = lodepng_add_itext(dest,source->itext_keys[sStack_28],source->itext_langtags[sStack_28],
                              source->itext_transkeys[sStack_28],source->itext_strings[sStack_28]);
    if (uVar1 != 0) break;
    sStack_28 = sStack_28 + 1;
  }
  return uVar1;
}

Assistant:

static unsigned LodePNGIText_copy(LodePNGInfo* dest, const LodePNGInfo* source) {
  size_t i = 0;
  dest->itext_keys = 0;
  dest->itext_langtags = 0;
  dest->itext_transkeys = 0;
  dest->itext_strings = 0;
  dest->itext_num = 0;
  for(i = 0; i != source->itext_num; ++i) {
    CERROR_TRY_RETURN(lodepng_add_itext(dest, source->itext_keys[i], source->itext_langtags[i],
                                        source->itext_transkeys[i], source->itext_strings[i]));
  }
  return 0;
}